

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

string * __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::toString
          (string *__return_storage_ptr__,
          Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_70);
  iVar1 = this->vertexCount;
  if (iVar1 == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
      GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_50,
                 (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&this->vertexList->index + lVar4));
      std::operator+(&local_70,&local_50," -> ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::toString(&local_50,
                 (SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&this->adjacencyList->head + lVar3));
      std::operator+(&local_70,&local_50,"\n");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      iVar1 = this->vertexCount;
      lVar3 = lVar3 + 0x18;
      lVar4 = lVar4 + 0x48;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Graph<T>::toString()
{
  std::string output = "";
  if(vertexCount == 0)
  {
    output += "[]\n";
  }

  else
  {
    for(int i = 0; i < vertexCount; i++)
    {
      output += vertexList[i].toString() +" -> "; // Region/ Zone

      output += adjacencyList[i].toString() + "\n"; // Connected regions and zones
    }
  }

  return output;
}